

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbopl.cpp
# Opt level: O0

void __thiscall DBOPL::Operator::Write20(Operator *this,Chip *chip,Bit8u val)

{
  byte bVar1;
  Bit8u change;
  Bit8u val_local;
  Chip *chip_local;
  Operator *this_local;
  
  bVar1 = this->reg20 ^ val;
  if (bVar1 != 0) {
    this->reg20 = val;
    this->tremoloMask = (char)val >> 7;
    this->tremoloMask = this->tremoloMask;
    if ((bVar1 & 0x10) != 0) {
      UpdateRates(this,chip);
    }
    if (((this->reg20 & 0x20) == 0) && (this->releaseAdd != 0)) {
      this->rateZero = this->rateZero & 0xfb;
    }
    else {
      this->rateZero = this->rateZero | 4;
    }
    if ((bVar1 & 0x4f) != 0) {
      this->freqMul = chip->freqMul[(int)(val & 0xf)];
      UpdateFrequency(this);
    }
  }
  return;
}

Assistant:

void Operator::Write20( const Chip* chip, Bit8u val ) {
	Bit8u change = (reg20 ^ val );
	if ( !change )
		return;
	reg20 = val;
	//Shift the tremolo bit over the entire register, saved a branch, YES!
	tremoloMask = (Bit8s)(val) >> 7;
	tremoloMask &= ~(( 1 << ENV_EXTRA ) -1);
	//Update specific features based on changes
	if ( change & MASK_KSR ) {
		UpdateRates( chip );
	}
	//With sustain enable the volume doesn't change
	if ( reg20 & MASK_SUSTAIN || ( !releaseAdd ) ) {
		rateZero |= ( 1 << SUSTAIN );
	} else {
		rateZero &= ~( 1 << SUSTAIN );
	}
	//Frequency multiplier or vibrato changed
	if ( change & (0xf | MASK_VIBRATO) ) {
		freqMul = chip->freqMul[ val & 0xf ];
		UpdateFrequency();
	}
}